

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataIndex.h
# Opt level: O1

string * __thiscall
MinVR::VRDataIndex::
addDataSpecialized<std::vector<float,std::allocator<float>>,(MinVR::VRCORETYPE_ID)5>
          (string *__return_storage_ptr__,VRDataIndex *this,string *key,
          vector<float,_std::allocator<float>_> *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  long *plVar4;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>
  _Var5;
  _Node *p_Var6;
  runtime_error *this_00;
  size_type *psVar7;
  VRDatumPtr *this_01;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>,_bool>
  pVar8;
  string ns;
  VRContainer cValue;
  VRDatumPtr obj;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>
  local_110;
  undefined1 local_e0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  VRDatumPtr local_b8;
  vector<float,_std::allocator<float>_> local_a8;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  undefined1 local_78 [40];
  string local_50;
  
  local_c0 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_c0;
  pcVar2 = (key->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + key->_M_string_length);
  if (*(key->_M_dataplus)._M_p != '/') {
    local_e0._0_8_ = (VRDatum_conflict *)(local_e0 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"/","");
    plVar4 = (long *)std::__cxx11::string::_M_append(local_e0,(ulong)(key->_M_dataplus)._M_p);
    paVar1 = &local_110.first.field_2;
    psVar7 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_110.first.field_2._M_allocated_capacity = *psVar7;
      local_110.first.field_2._8_8_ = plVar4[3];
      local_110.first._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_110.first.field_2._M_allocated_capacity = *psVar7;
      local_110.first._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_110.first._M_string_length = plVar4[1];
    *plVar4 = (long)psVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_110.first._M_dataplus._M_p,
                      local_110.first.field_2._M_allocated_capacity + 1);
    }
    if ((VRDatum_conflict *)local_e0._0_8_ != (VRDatum_conflict *)(local_e0 + 0x10)) {
      operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
    }
  }
  local_e0._0_8_ = (VRDatum_conflict *)0x0;
  local_e0._8_8_ = operator_new(4);
  ((VRDatumPtrRC *)local_e0._8_8_)->count = 1;
  local_110.first._M_dataplus._M_p = (pointer)&local_110.first.field_2;
  pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,pcVar2,pcVar2 + __return_storage_ptr__->_M_string_length);
  local_110.second.pData = (VRDatum_conflict *)local_e0._0_8_;
  local_110.second.reference = (VRDatumPtrRC *)local_e0._8_8_;
  *(int *)local_e0._8_8_ = *(int *)local_e0._8_8_ + 1;
  pVar8 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,MinVR::VRDatumPtr>,std::_Select1st<std::pair<std::__cxx11::string_const,MinVR::VRDatumPtr>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,MinVR::VRDatumPtr>>>
          ::_M_insert_unique<std::pair<std::__cxx11::string_const,MinVR::VRDatumPtr>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,MinVR::VRDatumPtr>,std::_Select1st<std::pair<std::__cxx11::string_const,MinVR::VRDatumPtr>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,MinVR::VRDatumPtr>>>
                      *)this,&local_110);
  _Var5 = pVar8.first._M_node;
  VRDatumPtr::~VRDatumPtr(&local_110.second);
  paVar1 = &local_110.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_110.first._M_dataplus._M_p,
                    local_110.first.field_2._M_allocated_capacity + 1);
  }
  VRDatumPtr::~VRDatumPtr((VRDatumPtr *)local_e0);
  if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (this->_overwrite < 1) {
      if (this->_overwrite != 0) {
        return __return_storage_ptr__;
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_110.first._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_110,"overwriting values not allowed","");
      std::runtime_error::runtime_error(this_00,(string *)&local_110);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_b8.pData = *(VRDatum_conflict **)(_Var5._M_node + 2);
    local_b8.reference = (VRDatumPtrRC *)_Var5._M_node[2]._M_parent;
    ((_Base_ptr)local_b8.reference)->_M_color = ((_Base_ptr)local_b8.reference)->_M_color + _S_black
    ;
    std::vector<float,_std::allocator<float>_>::vector(&local_a8,value);
    _setValueSpecialized(this,&local_b8,&local_a8);
    if (local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    this_01 = &local_b8;
  }
  else {
    VRDatumFactory::CreateVRDatum((VRDatumFactory *)local_78,0x178530,(void *)0x5);
    VRDatumPtr::operator=((VRDatumPtr *)(_Var5._M_node + 2),(VRDatumPtr *)local_78);
    local_90._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_90;
    local_90._M_impl._M_node._M_size = 0;
    local_90._M_impl._M_node.super__List_node_base._M_prev =
         local_90._M_impl._M_node.super__List_node_base._M_next;
    _explodeName((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_110,__return_storage_ptr__);
    p_Var6 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
             _M_create_node<std::__cxx11::string_const&>
                       ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_90
                        ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_110.first._M_string_length - 0x20));
    std::__detail::_List_node_base::_M_hook(&p_Var6->super__List_node_base);
    local_90._M_impl._M_node._M_size = local_90._M_impl._M_node._M_size + 1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_110);
    _getNameSpace(&local_110.first,__return_storage_ptr__);
    iVar3 = std::__cxx11::string::compare((char *)&local_110);
    if (iVar3 != 0) {
      std::__cxx11::string::substr((ulong)local_e0,(ulong)&local_110);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_78 + 0x10),
             (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_90);
      addData(&local_50,this,(string *)local_e0,(VRContainer *)(local_78 + 0x10));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::
      _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_78 + 0x10));
      if ((VRDatum_conflict *)local_e0._0_8_ != (VRDatum_conflict *)(local_e0 + 0x10)) {
        operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_110.first._M_dataplus._M_p,
                      local_110.first.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::
    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_clear(&local_90);
    this_01 = (VRDatumPtr *)local_78;
  }
  VRDatumPtr::~VRDatumPtr(this_01);
  return __return_storage_ptr__;
}

Assistant:

std::string addDataSpecialized(const std::string key, T value) {

    // All names must be in some namespace. If there is no namespace,
    // put this into the root namespace.
    std::string fixedValName = key;
    if (key[0] != '/') fixedValName = std::string("/") + key;

    std::pair<VRDataMap::iterator, bool>res =
      _theIndex.insert(VRDataMap::value_type(fixedValName, (VRDatumPtr)NULL));

    // Was it already used?
    if (res.second) {

      VRDatumPtr obj = _factory.CreateVRDatum(TID, &value);
      res.first->second = obj;

      // Add this value to the parent container, if any.
      VRContainer cValue;
      cValue.push_back(_explodeName(fixedValName).back());
      std::string ns = _getNameSpace(fixedValName);
      // The parent container is the namespace minus the trailing /.
      if (ns.compare("/") != 0) addData(ns.substr(0, ns.size() - 1), cValue);

    } else {

      // Entry already exists. Decide whether to modify or throw an exception.
      if (_overwrite > 0) {

        _setValueSpecialized(res.first->second, (T)value);

      } else if (_overwrite == 0) {

        throw std::runtime_error(std::string("overwriting values not allowed"));
      }
    }

    return fixedValName;
  }